

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astlist.c
# Opt level: O1

void InitParams(ASTList *params,int totalFuncs)

{
  undefined8 *puVar1;
  long lVar2;
  
  if (0 < totalFuncs) {
    lVar2 = 0;
    do {
      puVar1 = (undefined8 *)((long)&params->first + lVar2);
      *puVar1 = 0;
      puVar1[1] = 0;
      *(undefined8 *)((long)&params->current + lVar2) = 0;
      *(undefined8 *)((long)&params->size + lVar2) = 0xffffffffffffffff;
      lVar2 = lVar2 + 0x20;
    } while ((ulong)(uint)totalFuncs << 5 != lVar2);
  }
  return;
}

Assistant:

void InitParams(ASTList* params, int totalFuncs){
	for (int i = 0; i < totalFuncs; i++){
		params[i].first = NULL;
		params[i].last = NULL;
		params[i].current = NULL;
		params[i].size = -1;
		params[i].nodeId = -1;
	}
}